

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.h
# Opt level: O2

void __thiscall subprocess::detail::Child::execute_child(Child *this)

{
  uint __fd;
  long lVar1;
  Popen *pPVar2;
  int iVar3;
  OSError *this_00;
  int *piVar4;
  long in_FS_OFFSET;
  allocator<char> local_52;
  anon_class_1_0_00000001 local_51;
  string err_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pPVar2 = this->parent_;
  if ((pPVar2->stream_).write_to_parent_ == 0) {
    iVar3 = dup(0);
    (pPVar2->stream_).write_to_parent_ = iVar3;
  }
  __fd = (pPVar2->stream_).err_write_;
  if (__fd < 2) {
    iVar3 = dup(__fd);
    (pPVar2->stream_).err_write_ = iVar3;
  }
  execute_child::anon_class_1_0_00000001::operator()
            (&local_51,(pPVar2->stream_).read_from_parent_,0);
  execute_child::anon_class_1_0_00000001::operator()(&local_51,(pPVar2->stream_).write_to_parent_,1)
  ;
  execute_child::anon_class_1_0_00000001::operator()(&local_51,(pPVar2->stream_).err_write_,2);
  iVar3 = (pPVar2->stream_).read_from_parent_;
  if (2 < iVar3) {
    close(iVar3);
  }
  iVar3 = (pPVar2->stream_).write_to_parent_;
  if (2 < iVar3) {
    close(iVar3);
  }
  iVar3 = (pPVar2->stream_).err_write_;
  if (2 < iVar3) {
    close(iVar3);
  }
  iVar3 = execvp((this->parent_->exe_name_)._M_dataplus._M_p,
                 (this->parent_->cargv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl
                 .super__Vector_impl_data._M_start);
  if (iVar3 == -1) {
    this_00 = (OSError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>((string *)&err_msg,"execve failed",&local_52)
    ;
    piVar4 = __errno_location();
    OSError::OSError(this_00,&err_msg,*piVar4);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this_00,&OSError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    _exit(1);
  }
  __stack_chk_fail();
}

Assistant:

inline void Child::execute_child() {
#ifndef __USING_WINDOWS__
    int sys_ret = -1;
    auto& stream = parent_->stream_;

    try {
      if (stream.write_to_parent_ == 0)
        stream.write_to_parent_ = dup(stream.write_to_parent_);

      if (stream.err_write_ == 0 || stream.err_write_ == 1)
        stream.err_write_ = dup(stream.err_write_);

      // Make the child owned descriptors as the
      // stdin, stdout and stderr for the child process
      auto _dup2_ = [](int fd, int to_fd) {
        if (fd == to_fd) {
          // dup2 syscall does not reset the
          // CLOEXEC flag if the descriptors
          // provided to it are same.
          // But, we need to reset the CLOEXEC
          // flag as the provided descriptors
          // are now going to be the standard
          // input, output and error
          util::set_clo_on_exec(fd, false);
        } else if(fd != -1) {
          int res = dup2(fd, to_fd);
          if (res == -1) throw OSError("dup2 failed", errno);
        }
      };

      // Create the standard streams
      _dup2_(stream.read_from_parent_, 0); // Input stream
      _dup2_(stream.write_to_parent_,  1); // Output stream
      _dup2_(stream.err_write_,        2); // Error stream

      // Close the duped descriptors
      if (stream.read_from_parent_ != -1 && stream.read_from_parent_ > 2)
        close(stream.read_from_parent_);

      if (stream.write_to_parent_ != -1 && stream.write_to_parent_ > 2)
        close(stream.write_to_parent_);

      if (stream.err_write_ != -1 && stream.err_write_ > 2)
        close(stream.err_write_);

      // Replace the current image with the executable
      sys_ret = execvp(parent_->exe_name_.c_str(), parent_->cargv_.data());

      if (sys_ret == -1) throw OSError("execve failed", errno);

    } catch (const OSError& exp) {
      // Just write the exception message
      // TODO: Give back stack trace ?
      std::string err_msg(exp.what());
      //ATTN: Can we do something on error here ?
      util::write_n(err_wr_pipe_, err_msg.c_str(), err_msg.length());
    }

    // Calling application would not get this
    // exit failure
    _exit (EXIT_FAILURE);
#endif
  }